

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

string * __thiscall
flatbuffers::FlatCompiler::GetShortUsageString
          (string *__return_storage_ptr__,FlatCompiler *this,string *program_name)

{
  bool bVar1;
  ostream *poVar2;
  reference option_00;
  stringstream local_3a0 [8];
  stringstream ss_textwrap;
  undefined1 local_218 [8];
  string help;
  FlatCOption *option_1;
  FlatCOption *__end1_1;
  FlatCOption *__begin1_1;
  FlatCOption (*__range1_1) [90];
  FlatCOption *option;
  iterator __end1;
  iterator __begin1;
  set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_aardappel[P]flatbuffers_src_flatc_cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
  *__range1;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  string *local_20;
  string *program_name_local;
  FlatCompiler *this_local;
  
  local_20 = program_name;
  program_name_local = (string *)this;
  this_local = (FlatCompiler *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,"Usage: ");
  poVar2 = std::operator<<(poVar2,(string *)local_20);
  std::operator<<(poVar2," [");
  __end1 = std::
           set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/flatc.cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
           ::begin((set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_aardappel[P]flatbuffers_src_flatc_cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
                    *)language_options);
  option = (FlatCOption *)
           std::
           set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/flatc.cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
           ::end((set<flatbuffers::FlatCOption,_flatbuffers::(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_aardappel[P]flatbuffers_src_flatc_cpp:275:12),_std::allocator<flatbuffers::FlatCOption>_>
                  *)language_options);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&option);
    if (!bVar1) break;
    option_00 = std::_Rb_tree_const_iterator<flatbuffers::FlatCOption>::operator*(&__end1);
    AppendShortOption((stringstream *)local_1a8,option_00);
    std::operator<<(local_198,", ");
    std::_Rb_tree_const_iterator<flatbuffers::FlatCOption>::operator++(&__end1);
  }
  for (__end1_1 = (FlatCOption *)flatc_options; __end1_1 != (FlatCOption *)language_options;
      __end1_1 = __end1_1 + 1) {
    help.field_2._8_8_ = __end1_1;
    AppendShortOption((stringstream *)local_1a8,__end1_1);
    std::operator<<(local_198,", ");
  }
  std::ostream::seekp((long)local_198,~_S_cur);
  std::operator<<(local_198,"]... FILE... [-- BINARY_FILE...]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::stringstream(local_3a0);
  AppendTextWrappedString((stringstream *)local_3a0,(string *)local_218,0x50,0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string FlatCompiler::GetShortUsageString(
    const std::string &program_name) const {
  std::stringstream ss;
  ss << "Usage: " << program_name << " [";

  for (const FlatCOption &option : language_options) {
    AppendShortOption(ss, option);
    ss << ", ";
  }

  for (const FlatCOption &option : flatc_options) {
    AppendShortOption(ss, option);
    ss << ", ";
  }

  ss.seekp(-2, ss.cur);
  ss << "]... FILE... [-- BINARY_FILE...]";
  std::string help = ss.str();
  std::stringstream ss_textwrap;
  AppendTextWrappedString(ss_textwrap, help, 80, 0);
  return ss_textwrap.str();
}